

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>
::reject(AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>
         *this,Exception *exception)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ExceptionOrValue local_1e8;
  Maybe<capnp::AnyPointer::Pipeline> local_50;
  
  if (this->waiting == true) {
    this->waiting = false;
    local_1e8.exception.ptr.isSet = true;
    local_1e8.exception.ptr.field_1.value.ownFile.content.ptr = (exception->ownFile).content.ptr;
    local_1e8.exception.ptr.field_1.value.ownFile.content.size_ = (exception->ownFile).content.size_
    ;
    local_1e8.exception.ptr.field_1.value.ownFile.content.disposer =
         (exception->ownFile).content.disposer;
    (exception->ownFile).content.ptr = (char *)0x0;
    (exception->ownFile).content.size_ = 0;
    local_1e8.exception.ptr.field_1.value.file = exception->file;
    local_1e8.exception.ptr.field_1._32_4_ = exception->line;
    local_1e8.exception.ptr.field_1._36_4_ = exception->type;
    local_1e8.exception.ptr.field_1.value.description.content.ptr =
         (exception->description).content.ptr;
    local_1e8.exception.ptr.field_1.value.description.content.size_ =
         (exception->description).content.size_;
    local_1e8.exception.ptr.field_1.value.description.content.disposer =
         (exception->description).content.disposer;
    (exception->description).content.ptr = (char *)0x0;
    (exception->description).content.size_ = 0;
    local_1e8.exception.ptr.field_1.value.context.ptr.disposer = (exception->context).ptr.disposer;
    local_1e8.exception.ptr.field_1.value.context.ptr.ptr = (exception->context).ptr.ptr;
    (exception->context).ptr.ptr = (Context *)0x0;
    local_1e8.exception.ptr.field_1.value.remoteTrace.content.ptr =
         (exception->remoteTrace).content.ptr;
    local_1e8.exception.ptr.field_1.value.remoteTrace.content.size_ =
         (exception->remoteTrace).content.size_;
    local_1e8.exception.ptr.field_1.value.remoteTrace.content.disposer =
         (exception->remoteTrace).content.disposer;
    (exception->remoteTrace).content.ptr = (char *)0x0;
    (exception->remoteTrace).content.size_ = 0;
    memcpy((void *)((long)&local_1e8.exception.ptr.field_1 + 0x68),exception->trace,0x105);
    local_1e8.exception.ptr.field_1.value.details.builder.ptr = (exception->details).builder.ptr;
    local_1e8.exception.ptr.field_1.value.details.builder.pos = (exception->details).builder.pos;
    local_1e8.exception.ptr.field_1.value.details.builder.endPtr =
         (exception->details).builder.endPtr;
    local_1e8.exception.ptr.field_1.value.details.builder.disposer =
         (exception->details).builder.disposer;
    (exception->details).builder.endPtr = (Detail *)0x0;
    (exception->details).builder.ptr = (Detail *)0x0;
    (exception->details).builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
    local_50.ptr.isSet = false;
    ExceptionOrValue::operator=(&(this->result).super_ExceptionOrValue,&local_1e8);
    Maybe<capnp::AnyPointer::Pipeline>::operator=(&(this->result).value,&local_50);
    uVar2 = local_50.ptr.field_1.value.ops.size_;
    uVar1 = local_50.ptr.field_1.value.ops.ptr;
    if (local_50.ptr.isSet == true) {
      if (local_50.ptr.field_1.value.ops.ptr != (PipelineOp *)0x0) {
        local_50.ptr.field_1.value.ops.ptr = (PipelineOp *)0x0;
        local_50.ptr.field_1.value.ops.size_ = 0;
        (**(local_50.ptr.field_1.value.ops.disposer)->_vptr_ArrayDisposer)
                  (local_50.ptr.field_1.value.ops.disposer,uVar1,8,uVar2,uVar2,0);
      }
      uVar1 = local_50.ptr.field_1.value.hook.ptr;
      if (local_50.ptr.field_1.value.hook.ptr != (PipelineHook *)0x0) {
        local_50.ptr.field_1.value.hook.ptr = (PipelineHook *)0x0;
        (**(local_50.ptr.field_1.value.hook.disposer)->_vptr_Disposer)
                  (local_50.ptr.field_1.value.hook.disposer,
                   ((PipelineHook *)uVar1)->_vptr_PipelineHook[-2] +
                   (long)&((PipelineHook *)uVar1)->_vptr_PipelineHook);
      }
    }
    if (local_1e8.exception.ptr.isSet == true) {
      Exception::~Exception(&local_1e8.exception.ptr.field_1.value);
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }